

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

char * MIR_item_name(MIR_context_t ctx,MIR_item_t_conflict item)

{
  MIR_func_t pMVar1;
  
  if (item != (MIR_item_t_conflict)0x0) {
    switch(item->item_type) {
    case MIR_func_item:
    case MIR_proto_item:
    case MIR_data_item:
    case MIR_ref_data_item:
    case MIR_lref_data_item:
    case MIR_expr_data_item:
    case MIR_bss_item:
      pMVar1 = (item->u).func;
      break;
    case MIR_import_item:
    case MIR_export_item:
    case MIR_forward_item:
      pMVar1 = (MIR_func_t)&item->u;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x27e,"const char *MIR_item_name(MIR_context_t, MIR_item_t)");
    }
    return pMVar1->name;
  }
  __assert_fail("item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x272,"const char *MIR_item_name(MIR_context_t, MIR_item_t)");
}

Assistant:

const char *MIR_item_name (MIR_context_t ctx MIR_UNUSED, MIR_item_t item) {
  mir_assert (item != NULL);
  switch (item->item_type) {
  case MIR_func_item: return item->u.func->name;
  case MIR_proto_item: return item->u.proto->name;
  case MIR_import_item: return item->u.import_id;
  case MIR_export_item: return item->u.export_id;
  case MIR_forward_item: return item->u.forward_id;
  case MIR_bss_item: return item->u.bss->name;
  case MIR_data_item: return item->u.data->name;
  case MIR_ref_data_item: return item->u.ref_data->name;
  case MIR_lref_data_item: return item->u.lref_data->name;
  case MIR_expr_data_item: return item->u.expr_data->name;
  default: mir_assert (FALSE); return NULL;
  }
}